

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kmip.cpp
# Opt level: O2

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
Vault::Kmip::listRoles
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Kmip *this,Path *path)

{
  Client *client;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  Path local_80;
  Url local_60;
  string local_40;
  
  client = *(Client **)this;
  Vault::operator+(&local_40,"scope/",path);
  std::operator+(&local_a0,&local_40,"/role");
  local_80.value_._M_dataplus._M_p = (pointer)&local_80.value_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p == &local_a0.field_2) {
    local_80.value_.field_2._8_8_ = local_a0.field_2._8_8_;
  }
  else {
    local_80.value_._M_dataplus._M_p = local_a0._M_dataplus._M_p;
  }
  local_80.value_._M_string_length = local_a0._M_string_length;
  local_a0._M_string_length = 0;
  local_a0.field_2._M_local_buf[0] = '\0';
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  getUrl(&local_60,this,&local_80);
  HttpConsumer::list(__return_storage_ptr__,client,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string> Vault::Kmip::listRoles(const Path &path) {
  return HttpConsumer::list(client_, getUrl(Path{"scope/" + path + "/role"}));
}